

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void memory_usage_test(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ostream *this;
  size_t u2;
  shared_ptr<int> x;
  size_t u1;
  
  x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QUtil::get_max_memory_usage();
  if (x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    QUtil::make_shared_array<int>((QUtil *)&u2,0xa00000);
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QUtil::get_max_memory_usage();
    if (p_Var1 <= x.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
      __assert_fail("u2 > u1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0x2dc,"void memory_usage_test()");
    }
    std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)&u2);
  }
  this = std::operator<<((ostream *)&std::cout,"memory usage okay");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
memory_usage_test()
{
    auto u1 = QUtil::get_max_memory_usage();
    if (u1 > 0) {
        auto x = QUtil::make_shared_array<int>(10 << 20);
        auto u2 = QUtil::get_max_memory_usage();
        assert(u2 > u1);
    }
    std::cout << "memory usage okay" << std::endl;
}